

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

void __thiscall
google::protobuf::TextFormat::Printer::Print
          (Printer *this,Message *message,BaseTextGenerator *generator)

{
  MessagePrinter *pMVar1;
  bool bVar2;
  pointer prVar3;
  Metadata MVar4;
  Descriptor *descriptor;
  undefined8 uStack_60;
  const_iterator itr;
  ArrayInputStream input;
  
  MVar4 = Message::GetMetadata(message);
  if (MVar4.reflection == (Reflection *)0x0) {
    descriptor = (Descriptor *)0x0;
    uStack_60 = (anon_union_8_2_4f9aec01_for_ShortSooRep_1)0x0;
    MessageLite::SerializeAsString_abi_cxx11_((string *)&itr,&message->super_MessageLite);
    io::ArrayInputStream::ArrayInputStream(&input,itr.inner_.ctrl_,itr.inner_.field_1._0_4_,-1);
    UnknownFieldSet::ParseFromZeroCopyStream
              ((UnknownFieldSet *)&descriptor,&input.super_ZeroCopyInputStream);
    std::__cxx11::string::~string((string *)&itr);
    PrintUnknownFields(this,(UnknownFieldSet *)&descriptor,generator,10);
    UnknownFieldSet::~UnknownFieldSet((UnknownFieldSet *)&descriptor);
  }
  else {
    MVar4 = Message::GetMetadata(message);
    descriptor = MVar4.descriptor;
    itr.inner_ = absl::lts_20240722::container_internal::
                 raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,std::unique_ptr<google::protobuf::TextFormat::MessagePrinter_const,std::default_delete<google::protobuf::TextFormat::MessagePrinter_const>>>,absl::lts_20240722::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::Descriptor_const*const,std::unique_ptr<google::protobuf::TextFormat::MessagePrinter_const,std::default_delete<google::protobuf::TextFormat::MessagePrinter_const>>>>>
                 ::find<google::protobuf::Descriptor_const*>
                           ((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,std::unique_ptr<google::protobuf::TextFormat::MessagePrinter_const,std::default_delete<google::protobuf::TextFormat::MessagePrinter_const>>>,absl::lts_20240722::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::Descriptor_const*const,std::unique_ptr<google::protobuf::TextFormat::MessagePrinter_const,std::default_delete<google::protobuf::TextFormat::MessagePrinter_const>>>>>
                             *)&this->custom_message_printers_,&descriptor);
    input.super_ZeroCopyInputStream._vptr_ZeroCopyInputStream = (_func_int **)0x0;
    bVar2 = absl::lts_20240722::container_internal::operator!=(&itr,(const_iterator *)&input);
    if (bVar2) {
      prVar3 = absl::lts_20240722::container_internal::
               raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>_>_>
               ::iterator::operator->(&itr.inner_);
      pMVar1 = (prVar3->second)._M_t.
               super___uniq_ptr_impl<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>
               ._M_t.
               super__Tuple_impl<0UL,_const_google::protobuf::TextFormat::MessagePrinter_*,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>
               .super__Head_base<0UL,_const_google::protobuf::TextFormat::MessagePrinter_*,_false>.
               _M_head_impl;
      (**(code **)(*(long *)pMVar1 + 0x10))(pMVar1,message,this->single_line_mode_,generator);
    }
    else {
      PrintMessage(this,message,generator);
    }
  }
  return;
}

Assistant:

void TextFormat::Printer::Print(const Message& message,
                                BaseTextGenerator* generator) const {
  const Reflection* reflection = message.GetReflection();
  if (!reflection) {
    // This message does not provide any way to describe its structure.
    // Parse it again in an UnknownFieldSet, and display this instead.
    UnknownFieldSet unknown_fields;
    {
      std::string serialized = message.SerializeAsString();
      io::ArrayInputStream input(serialized.data(), serialized.size());
      unknown_fields.ParseFromZeroCopyStream(&input);
    }
    PrintUnknownFields(unknown_fields, generator, kUnknownFieldRecursionLimit);
    return;
  }
  const Descriptor* descriptor = message.GetDescriptor();
  auto itr = custom_message_printers_.find(descriptor);
  if (itr != custom_message_printers_.end()) {
    itr->second->Print(message, single_line_mode_, generator);
    return;
  }
  PrintMessage(message, generator);
}